

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,Box2i *displayWindow,Box2i *dataWindow,
          RgbaChannels rgbaChannels,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression,int numThreads)

{
  undefined4 extraout_EAX;
  Data *this_00;
  RgbaOutputFile *this_01;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  Header newHeader;
  Header local_68;
  
  this->_vptr_AcesOutputFile = (_func_int **)&PTR__AcesOutputFile_0049db18;
  this_00 = (Data *)operator_new(8);
  Data::Data(this_00);
  this->_data = this_00;
  anon_unknown_14::checkCompression(compression);
  iVar2 = -(uint)((dataWindow->max).x < (dataWindow->min).x);
  iVar3 = -(uint)((dataWindow->max).y < (dataWindow->min).y);
  auVar1._4_4_ = iVar2;
  auVar1._0_4_ = iVar2;
  auVar1._8_4_ = iVar3;
  auVar1._12_4_ = iVar3;
  iVar2 = movmskpd(extraout_EAX,auVar1);
  if (iVar2 != 0) {
    dataWindow = displayWindow;
  }
  Header::Header(&local_68,displayWindow,dataWindow,pixelAspectRatio,screenWindowCenter,
                 screenWindowWidth,lineOrder,compression);
  acesChromaticities();
  addChromaticities(&local_68,&acesChromaticities::acesChr);
  acesChromaticities();
  addAdoptedNeutral(&local_68,&acesChromaticities::acesChr.white);
  this_01 = (RgbaOutputFile *)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile(this_01,(name->_M_dataplus)._M_p,&local_68,rgbaChannels,numThreads)
  ;
  this->_data->rgbaFile = this_01;
  RgbaOutputFile::setYCRounding(this_01,7,6);
  Header::~Header(&local_68);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile
    (const std::string &name,
     const IMATH_NAMESPACE::Box2i &displayWindow,
     const IMATH_NAMESPACE::Box2i &dataWindow,
     RgbaChannels rgbaChannels,
     float pixelAspectRatio,
     const IMATH_NAMESPACE::V2f screenWindowCenter,
     float screenWindowWidth,
     LineOrder lineOrder,
     Compression compression,
     int numThreads)
:
    _data (new Data)
{
    checkCompression (compression);

    Header newHeader (displayWindow,
		      dataWindow.isEmpty()? displayWindow: dataWindow,
		      pixelAspectRatio,
		      screenWindowCenter,
		      screenWindowWidth,
		      lineOrder,
		      compression);

    addChromaticities (newHeader, acesChromaticities());
    addAdoptedNeutral (newHeader, acesChromaticities().white);

    _data->rgbaFile = new RgbaOutputFile (name.c_str(),
					  newHeader,
					  rgbaChannels,
					  numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}